

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

FeatureOptions<wasm::SIMDExtractOp> * __thiscall
wasm::Random::FeatureOptions<wasm::SIMDExtractOp>::add<>
          (FeatureOptions<wasm::SIMDExtractOp> *this,FeatureSet feature,SIMDExtractOp option)

{
  mapped_type *this_00;
  key_type local_20;
  SIMDExtractOp local_1c;
  FeatureSet feature_local;
  SIMDExtractOp option_local;
  
  local_20.features = feature.features;
  local_1c = option;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>_>_>
            ::operator[](&this->options,&local_20);
  std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>::push_back
            (this_00,&local_1c);
  return this;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }